

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_polygon_mesh.cpp
# Opt level: O0

void __thiscall
geometrycentral::surface::SimplePolygonMesh::readMeshFromAsciiStlFile
          (SimplePolygonMesh *this,istream *in)

{
  bool bVar1;
  __type _Var2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  undefined8 in_RSI;
  long in_RDI;
  Vector3 faceNormal;
  Vector3 position;
  vector<unsigned_long,_std::allocator<unsigned_long>_> face;
  Vector3 normal;
  anon_class_1_0_00000001 startsWithToken;
  anon_class_32_4_26ba02a2 nextLine;
  anon_class_24_3_19152d57 assertToken;
  size_t lineNum;
  stringstream ss;
  string line;
  iterator in_stack_fffffffffffffb58;
  iterator in_stack_fffffffffffffb60;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffb68;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffb70;
  Vector3 *in_stack_fffffffffffffb88;
  istream *in_stack_fffffffffffffb90;
  byte local_43a;
  byte local_402;
  Vector3 local_3e8;
  Vector3 local_3d0;
  Vector3 local_3b8;
  allocator local_399;
  string local_398 [32];
  long local_378;
  allocator local_351;
  string local_350 [37];
  byte local_32b;
  byte local_32a;
  allocator local_329;
  string local_328 [32];
  string local_308 [16];
  anon_class_32_4_26ba02a2 *in_stack_fffffffffffffd08;
  allocator local_2e9;
  string local_2e8 [24];
  string *in_stack_fffffffffffffd30;
  string *in_stack_fffffffffffffd38;
  anon_class_1_0_00000001 *in_stack_fffffffffffffd40;
  Vector3 local_2a0;
  allocator local_281;
  string local_280 [39];
  allocator local_259;
  string *in_stack_fffffffffffffda8;
  anon_class_24_3_19152d57 *in_stack_fffffffffffffdb0;
  allocator local_231;
  string local_230 [40];
  undefined8 local_208;
  string *local_200;
  stringstream *local_1f8;
  undefined8 *local_1f0;
  stringstream *local_1e8;
  undefined8 *local_1e0;
  string *local_1d8;
  undefined8 local_1d0 [3];
  stringstream local_1b8 [392];
  string local_30 [32];
  undefined8 local_10;
  
  local_10 = in_RSI;
  clear((SimplePolygonMesh *)in_stack_fffffffffffffb60._M_current);
  ::std::__cxx11::string::string(local_30);
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  local_1d0[0] = 1;
  local_1f8 = local_1b8;
  local_1f0 = local_1d0;
  local_200 = local_30;
  local_208 = local_10;
  local_1e8 = local_1f8;
  local_1e0 = local_1f0;
  local_1d8 = local_200;
  readMeshFromAsciiStlFile::anon_class_32_4_26ba02a2::operator()(in_stack_fffffffffffffd08);
  while( true ) {
    bVar1 = readMeshFromAsciiStlFile::anon_class_32_4_26ba02a2::operator()
                      (in_stack_fffffffffffffd08);
    local_402 = 0;
    if (bVar1) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_230,"endsolid",&local_231);
      _Var2 = readMeshFromAsciiStlFile::anon_class_1_0_00000001::operator()
                        (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                         in_stack_fffffffffffffd30);
      local_402 = _Var2 ^ 0xff;
      ::std::__cxx11::string::~string(local_230);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_231);
    }
    if ((local_402 & 1) == 0) break;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&stack0xfffffffffffffda8,"facet",&local_259);
    readMeshFromAsciiStlFile::anon_class_24_3_19152d57::operator()
              (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffda8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_259);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_280,"normal",&local_281);
    readMeshFromAsciiStlFile::anon_class_24_3_19152d57::operator()
              (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    ::std::__cxx11::string::~string(local_280);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_281);
    operator>>(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
    readMeshFromAsciiStlFile::anon_class_32_4_26ba02a2::operator()(in_stack_fffffffffffffd08);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffd40,"outer",(allocator *)&stack0xfffffffffffffd3f);
    readMeshFromAsciiStlFile::anon_class_24_3_19152d57::operator()
              (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffd40);
    ::std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd3f);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_2e8,"loop",&local_2e9);
    readMeshFromAsciiStlFile::anon_class_24_3_19152d57::operator()
              (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    ::std::__cxx11::string::~string(local_2e8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x27423a);
    while( true ) {
      local_32a = 0;
      local_32b = 0;
      bVar1 = readMeshFromAsciiStlFile::anon_class_32_4_26ba02a2::operator()
                        (in_stack_fffffffffffffd08);
      local_43a = 0;
      if (bVar1) {
        ::std::allocator<char>::allocator();
        local_32a = 1;
        ::std::__cxx11::string::string(local_328,"endloop",&local_329);
        local_32b = 1;
        _Var2 = readMeshFromAsciiStlFile::anon_class_1_0_00000001::operator()
                          (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                           in_stack_fffffffffffffd30);
        local_43a = _Var2 ^ 0xff;
      }
      if ((local_32b & 1) != 0) {
        ::std::__cxx11::string::~string(local_328);
      }
      if ((local_32a & 1) != 0) {
        ::std::allocator<char>::~allocator((allocator<char> *)&local_329);
      }
      if ((local_43a & 1) == 0) break;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_350,"vertex",&local_351);
      readMeshFromAsciiStlFile::anon_class_24_3_19152d57::operator()
                (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      ::std::__cxx11::string::~string(local_350);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_351);
      operator>>(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
      ::std::vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>::push_back
                ((vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_> *)
                 in_stack_fffffffffffffb70._M_current,
                 (value_type *)in_stack_fffffffffffffb68._M_current);
      sVar3 = ::std::vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>::
              size((vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_> *)
                   (in_RDI + 0x18));
      local_378 = sVar3 - 1;
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 in_stack_fffffffffffffb60._M_current,in_stack_fffffffffffffb58._M_current);
    }
    readMeshFromAsciiStlFile::anon_class_32_4_26ba02a2::operator()(in_stack_fffffffffffffd08);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_398,"endfacet",&local_399);
    readMeshFromAsciiStlFile::anon_class_24_3_19152d57::operator()
              (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    ::std::__cxx11::string::~string(local_398);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_399);
    in_stack_fffffffffffffb90 = (istream *)(in_RDI + 0x18);
    in_stack_fffffffffffffb88 = (Vector3 *)(local_328 + 0x20);
    pvVar4 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_fffffffffffffb88,1);
    pvVar5 = ::std::vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>::
             operator[]((vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>
                         *)in_stack_fffffffffffffb90,*pvVar4);
    pvVar4 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_fffffffffffffb88,0);
    pvVar6 = ::std::vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>::
             operator[]((vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>
                         *)in_stack_fffffffffffffb90,*pvVar4);
    Vector3::operator-(&local_3d0,pvVar5,pvVar6);
    in_stack_fffffffffffffb70._M_current = (unsigned_long *)(local_328 + 0x20);
    pvVar4 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_fffffffffffffb70._M_current,2);
    pvVar5 = ::std::vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>::
             operator[]((vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>
                         *)(in_RDI + 0x18),*pvVar4);
    pvVar4 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_fffffffffffffb70._M_current,0);
    pvVar6 = ::std::vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>::
             operator[]((vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>
                         *)(in_RDI + 0x18),*pvVar4);
    Vector3::operator-(&local_3e8,pvVar5,pvVar6);
    cross(&local_3b8,&local_3d0,&local_3e8);
    in_stack_fffffffffffffb68._M_current = (unsigned_long *)dot(&local_3b8,&local_2a0);
    if ((double)in_stack_fffffffffffffb68._M_current < 0.0) {
      in_stack_fffffffffffffb60 =
           ::std::begin<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                     (in_stack_fffffffffffffb58._M_current);
      in_stack_fffffffffffffb58 =
           ::std::end<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                     (in_stack_fffffffffffffb58._M_current);
      ::std::
      reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
    }
    ::std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::push_back((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 *)in_stack_fffffffffffffb70._M_current,
                (value_type *)in_stack_fffffffffffffb68._M_current);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffffb70._M_current);
  }
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void SimplePolygonMesh::readMeshFromAsciiStlFile(std::istream& in) {
  clear();

  std::string line;
  std::stringstream ss;
  size_t lineNum = 1;

  auto assertToken = [&](const std::string& expected) {
    std::string token;
    ss >> token;
    if (token != expected) {
      std::ostringstream errorMessage;
      errorMessage << "Failed to parse ASCII stl file." << std::endl
                   << "Error on line " << lineNum << ". Expected \"" << expected << "\" but token \"" << token << "\""
                   << std::endl
                   << "Full line: \"" << line << "\"" << std::endl;
      throw std::runtime_error(errorMessage.str());
    }
  };

  auto nextLine = [&]() {
    if (!getline(in, line)) {
      return false;
    }

    ss = std::stringstream(line);
    lineNum++;
    return true;
  };

  auto startsWithToken = [](const std::string& str, const std::string& prefix) {
    std::stringstream ss(str);
    std::string token;
    ss >> token;
    return token == prefix;
  };
  // Eat the header line
  nextLine();  
  // Parse STL file
  while (nextLine() && !startsWithToken(line, "endsolid")) {
    assertToken("facet");
    assertToken("normal");

    // TODO: store this normal?
    Vector3 normal;
    ss >> normal;

    nextLine();

    assertToken("outer");
    assertToken("loop");

    std::vector<size_t> face;
    while (nextLine() && !startsWithToken(line, "endloop")) {
      assertToken("vertex");

      Vector3 position;
      ss >> position;
      vertexCoordinates.push_back(position);

      face.push_back(vertexCoordinates.size() - 1);
    }

    nextLine();
    assertToken("endfacet");

    // Orient face using normal
    Vector3 faceNormal = cross(vertexCoordinates[face[1]] - vertexCoordinates[face[0]],
                               vertexCoordinates[face[2]] - vertexCoordinates[face[0]]);
    if (dot(faceNormal, normal) < 0) {
      std::reverse(std::begin(face), std::end(face));
    }

    polygons.push_back(face);
  }
}